

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::remove_unused_stmts(Generator *top)

{
  undefined1 local_58 [8];
  UnusedTopBlockVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  UnusedTopBlockVisitor::UnusedTopBlockVisitor((UnusedTopBlockVisitor *)local_58);
  IRVisitor::visit_generator_root
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  UnusedTopBlockVisitor::~UnusedTopBlockVisitor((UnusedTopBlockVisitor *)local_58);
  return;
}

Assistant:

void remove_unused_stmts(Generator* top) {
    // for now we'll just remove the top level unused blocks
    // ideally this should be done through multiple rounds to avoid circular reference,
    // removed dead stmts and other problems. It should also remove all the other empty statements
    UnusedTopBlockVisitor visitor;
    visitor.visit_generator_root(top);
}